

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_commit_phase2(Pager *pPager)

{
  Pager *pPager_local;
  
  if (((pPager->is_mem == 0) && (pPager->iState != 0)) && (pPager->iState != 1)) {
    if (pPager->no_jrnl == 0) {
      unqliteOsDelete(pPager->pVfs,pPager->zJournal,1);
    }
    pager_unlock_db(pPager,1);
    pPager->iState = 1;
    if (pPager->pVec != (Bitvec *)0x0) {
      unqliteBitvecDestroy(pPager->pVec);
      pPager->pVec = (Bitvec *)0x0;
    }
  }
  return 0;
}

Assistant:

static int pager_commit_phase2(Pager *pPager)
{
	if( !pPager->is_mem ){
		if( pPager->iState == PAGER_OPEN ){
			return UNQLITE_OK;
		}
		if( pPager->iState != PAGER_READER ){
			if( !pPager->no_jrnl ){
				/* Finally, unlink the journal file */
				unqliteOsDelete(pPager->pVfs,pPager->zJournal,1);
			}
			/* Downgrade to shared lock */
			pager_unlock_db(pPager,SHARED_LOCK);
			pPager->iState = PAGER_READER;
			if( pPager->pVec ){
				unqliteBitvecDestroy(pPager->pVec);
				pPager->pVec = 0;
			}
		}
	}
	return UNQLITE_OK;
}